

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

QpVector * __thiscall QpVector::repopulate(QpVector *this,QpVector *other)

{
  value_type vVar1;
  value_type vVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  int *in_RSI;
  QpVector *in_RDI;
  HighsInt i;
  QpVector *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *this_00;
  int local_14;
  
  reset(in_stack_ffffffffffffffd0);
  for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_14);
    vVar2 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_14);
    *pvVar4 = vVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_14);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)*pvVar4);
    vVar1 = *pvVar5;
    this_00 = &in_RDI->value;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_14);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar4);
    *pvVar6 = vVar1;
  }
  in_RDI->num_nz = *in_RSI;
  return in_RDI;
}

Assistant:

QpVector& repopulate(const QpVector& other) {
    reset();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      index[i] = other.index[i];
      value[index[i]] = other.value[index[i]];
    }
    num_nz = other.num_nz;
    return *this;
  }